

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O0

_Bool is_block_terminated(BasicBlock *block)

{
  Instruction *pIVar1;
  Instruction *last_insn;
  BasicBlock *block_local;
  
  pIVar1 = raviX_last_instruction(block);
  if (pIVar1 == (Instruction *)0x0) {
    block_local._7_1_ = false;
  }
  else if (((*(char *)pIVar1 == '\x01') || (*(char *)pIVar1 == 'H')) || (*(char *)pIVar1 == 'I')) {
    block_local._7_1_ = true;
  }
  else {
    block_local._7_1_ = false;
  }
  return block_local._7_1_;
}

Assistant:

static bool is_block_terminated(BasicBlock *block)
{
	Instruction *last_insn = raviX_last_instruction(block);
	if (last_insn == NULL)
		return false;
	if (last_insn->opcode == op_ret || last_insn->opcode == op_cbr || last_insn->opcode == op_br)
		return true;
	return false;
}